

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O1

int Cudd_DumpBlif(DdManager *dd,int n,DdNode **f,char **inames,char **onames,char *mname,FILE *fp,
                 int mv)

{
  int *piVar1;
  size_t __size;
  uint uVar2;
  DdNode *pDVar3;
  int iVar4;
  int iVar5;
  void *__s;
  DdNode *n_00;
  ulong uVar6;
  
  iVar5 = dd->size;
  __size = (long)iVar5 * 4;
  __s = malloc(__size);
  if (__s == (void *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
LAB_00910220:
    __s = (void *)0x0;
  }
  else {
    if (0 < iVar5) {
      memset(__s,0,__size);
    }
    n_00 = Cudd_VectorSupport(dd,f,n);
    if (n_00 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      uVar2 = n_00->index;
      pDVar3 = n_00;
      while (uVar2 != 0x7fffffff) {
        *(undefined4 *)((long)__s + (ulong)uVar2 * 4) = 1;
        pDVar3 = (pDVar3->type).kids.T;
        uVar2 = pDVar3->index;
      }
      Cudd_RecursiveDeref(dd,n_00);
      if (mname == (char *)0x0) {
        iVar4 = fprintf((FILE *)fp,".model DD\n.inputs");
      }
      else {
        iVar4 = fprintf((FILE *)fp,".model %s\n.inputs",mname);
      }
      if (iVar4 == -1) goto LAB_00910377;
      if (0 < iVar5) {
        uVar6 = 0;
        do {
          if (*(int *)((long)__s + uVar6 * 4) != 0) {
            if (inames == (char **)0x0) {
              iVar4 = fprintf((FILE *)fp," %d",uVar6 & 0xffffffff);
            }
            else {
              iVar4 = fprintf((FILE *)fp," %s",inames[uVar6]);
            }
            if (iVar4 == -1) goto LAB_00910222;
          }
          uVar6 = uVar6 + 1;
        } while ((long)iVar5 != uVar6);
      }
      free(__s);
      __s = (void *)0x0;
      iVar5 = fprintf((FILE *)fp,"\n.outputs");
      if (iVar5 != -1) {
        if (0 < n) {
          __s = (void *)0x0;
          uVar6 = 0;
          do {
            if (onames == (char **)0x0) {
              iVar5 = fprintf((FILE *)fp," f%d",uVar6 & 0xffffffff);
            }
            else {
              iVar5 = fprintf((FILE *)fp," %s",onames[uVar6]);
            }
            if (iVar5 == -1) goto LAB_00910222;
            uVar6 = uVar6 + 1;
          } while ((uint)n != uVar6);
        }
        __s = (void *)0x0;
        iVar5 = fprintf((FILE *)fp,"\n");
        if (iVar5 != -1) {
          iVar5 = Cudd_DumpBlifBody(dd,n,f,inames,onames,fp,mv);
          if (iVar5 == 0) goto LAB_00910220;
          __s = (void *)0x0;
          iVar5 = fprintf((FILE *)fp,".end\n");
          if (iVar5 != -1) {
            return 1;
          }
        }
      }
    }
  }
LAB_00910222:
  if (__s == (void *)0x0) {
    return 0;
  }
LAB_00910377:
  free(__s);
  return 0;
}

Assistant:

int
Cudd_DumpBlif(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  char * mname /* model name (or NULL) */,
  FILE * fp /* pointer to the dump file */,
  int mv /* 0: blif, 1: blif-MV */)
{
    DdNode      *support = NULL;
    DdNode      *scan;
    int         *sorted = NULL;
    int         nvars = dd->size;
    int         retval;
    int         i;

    /* Build a bit array with the support of f. */
    sorted = ABC_ALLOC(int,nvars);
    if (sorted == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        goto failure;
    }
    for (i = 0; i < nvars; i++) sorted[i] = 0;

    /* Take the union of the supports of each output function. */
    support = Cudd_VectorSupport(dd,f,n);
    if (support == NULL) goto failure;
    cuddRef(support);
    scan = support;
    while (!cuddIsConstant(scan)) {
        sorted[scan->index] = 1;
        scan = cuddT(scan);
    }
    Cudd_RecursiveDeref(dd,support);
    support = NULL; /* so that we do not try to free it in case of failure */

    /* Write the header (.model .inputs .outputs). */
    if (mname == NULL) {
        retval = fprintf(fp,".model DD\n.inputs");
    } else {
        retval = fprintf(fp,".model %s\n.inputs",mname);
    }
    if (retval == EOF) {
        ABC_FREE(sorted);
        return(0);
    }

    /* Write the input list by scanning the support array. */
    for (i = 0; i < nvars; i++) {
        if (sorted[i]) {
            if (inames == NULL) {
                retval = fprintf(fp," %d", i);
            } else {
                retval = fprintf(fp," %s", inames[i]);
            }
            if (retval == EOF) goto failure;
        }
    }
    ABC_FREE(sorted);
    sorted = NULL;

    /* Write the .output line. */
    retval = fprintf(fp,"\n.outputs");
    if (retval == EOF) goto failure;
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp," f%d", i);
        } else {
            retval = fprintf(fp," %s", onames[i]);
        }
        if (retval == EOF) goto failure;
    }
    retval = fprintf(fp,"\n");
    if (retval == EOF) goto failure;

    retval = Cudd_DumpBlifBody(dd, n, f, inames, onames, fp, mv);
    if (retval == 0) goto failure;

    /* Write trailer and return. */
    retval = fprintf(fp,".end\n");
    if (retval == EOF) goto failure;

    return(1);

failure:
    if (sorted != NULL) ABC_FREE(sorted);
    if (support != NULL) Cudd_RecursiveDeref(dd,support);
    return(0);

}